

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O3

AMQP_VALUE
messaging_delivery_modified
          (_Bool delivery_failed,_Bool undeliverable_here,fields message_annotations)

{
  int iVar1;
  MODIFIED_HANDLE modified;
  LOGGER_LOG p_Var2;
  AMQP_VALUE pAVar3;
  char *pcVar4;
  
  modified = modified_create();
  if (modified == (MODIFIED_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                ,"messaging_delivery_modified",0x102,1,
                "Cannot create MODIFIED delivery state handle");
      return (AMQP_VALUE)0x0;
    }
    return (AMQP_VALUE)0x0;
  }
  iVar1 = modified_set_delivery_failed(modified,delivery_failed);
  if (iVar1 == 0) {
    iVar1 = modified_set_undeliverable_here(modified,undeliverable_here);
    if (iVar1 == 0) {
      if ((message_annotations == (fields)0x0) ||
         (iVar1 = modified_set_message_annotations(modified,message_annotations), iVar1 == 0)) {
        pAVar3 = amqpvalue_create_modified(modified);
        if (pAVar3 != (AMQP_VALUE)0x0) goto LAB_0015693b;
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar4 = "Cannot create MODIFIED delivery state AMQP value";
          iVar1 = 0x11b;
          goto LAB_0015689d;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar4 = "Cannot set message annotations on MODIFIED delivery state";
          iVar1 = 0x113;
          goto LAB_0015689d;
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "Cannot set undeliverable here on MODIFIED delivery state";
        iVar1 = 0x10e;
        goto LAB_0015689d;
      }
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "Cannot set delivery failed on MODIFIED delivery state";
      iVar1 = 0x109;
LAB_0015689d:
      pAVar3 = (AMQP_VALUE)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                ,"messaging_delivery_modified",iVar1,1,pcVar4);
      goto LAB_0015693b;
    }
  }
  pAVar3 = (AMQP_VALUE)0x0;
LAB_0015693b:
  modified_destroy(modified);
  return pAVar3;
}

Assistant:

AMQP_VALUE messaging_delivery_modified(bool delivery_failed, bool undeliverable_here, fields message_annotations)
{
    AMQP_VALUE result;
    MODIFIED_HANDLE modified = modified_create();
    if (modified == NULL)
    {
        LogError("Cannot create MODIFIED delivery state handle");
        result = NULL;
    }
    else
    {
        if (modified_set_delivery_failed(modified, delivery_failed) != 0)
        {
            LogError("Cannot set delivery failed on MODIFIED delivery state");
            result = NULL;
        }
        else if (modified_set_undeliverable_here(modified, undeliverable_here) != 0)
        {
            LogError("Cannot set undeliverable here on MODIFIED delivery state");
            result = NULL;
        }
        else if ((message_annotations != NULL) && (modified_set_message_annotations(modified, message_annotations) != 0))
        {
            LogError("Cannot set message annotations on MODIFIED delivery state");
            result = NULL;
        }
        else
        {
            result = amqpvalue_create_modified(modified);
            if (result == NULL)
            {
                LogError("Cannot create MODIFIED delivery state AMQP value");
            }
            else
            {
                /* all ok */
            }
        }

        modified_destroy(modified);
    }

    return result;
}